

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.cpp
# Opt level: O2

void duckdb::StringColumnReader::VerifyString(char *str_data,uint32_t str_len,bool is_varchar)

{
  UnicodeType UVar1;
  InvalidInputException *this;
  size_t *invalid_pos;
  undefined7 in_register_00000011;
  string_t blob;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  UnicodeInvalidReason reason;
  size_t pos;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((int)CONCAT71(in_register_00000011,is_varchar) != 0) {
    invalid_pos = &pos;
    UVar1 = Utf8Proc::Analyze(str_data,(ulong)str_len,&reason,invalid_pos);
    if (UVar1 == INVALID) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      if (str_len < 0xd) {
        uStack_9c = 0;
        uStack_a4 = 0;
        uStack_a0 = 0;
        if (str_len == 0) {
          str_data = (char *)0x0;
        }
        else {
          switchD_00917c1c::default(&uStack_a4,str_data,(ulong)str_len);
          str_data = (char *)CONCAT44(uStack_9c,uStack_a0);
        }
      }
      else {
        uStack_a4 = *(undefined4 *)str_data;
      }
      blob.value.pointer.ptr = (char *)invalid_pos;
      blob.value._0_8_ = str_data;
      Blob::ToString_abi_cxx11_(&local_88,(Blob *)CONCAT44(uStack_a4,str_len),blob);
      ::std::operator+(&local_68,"Invalid string encoding found in Parquet file: value \"",&local_88
                      );
      ::std::operator+(&local_48,&local_68,"\" is not valid UTF8!");
      InvalidInputException::InvalidInputException(this,&local_48);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void StringColumnReader::VerifyString(const char *str_data, uint32_t str_len, const bool is_varchar) {
	if (!is_varchar) {
		return;
	}
	// verify if a string is actually UTF8, and if there are no null bytes in the middle of the string
	// technically Parquet should guarantee this, but reality is often disappointing
	UnicodeInvalidReason reason;
	size_t pos;
	auto utf_type = Utf8Proc::Analyze(str_data, str_len, &reason, &pos);
	if (utf_type == UnicodeType::INVALID) {
		throw InvalidInputException("Invalid string encoding found in Parquet file: value \"" +
		                            Blob::ToString(string_t(str_data, str_len)) + "\" is not valid UTF8!");
	}
}